

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

QRectF * __thiscall QRasterPaintEngine::clipBoundingRect(QRasterPaintEngine *this)

{
  QRasterPaintEnginePrivate *this_00;
  QClipData *r;
  QRectF *in_RDI;
  QClipData *clip;
  QRasterPaintEnginePrivate *d;
  QRasterPaintEnginePrivate *in_stack_ffffffffffffffe8;
  
  this_00 = d_func((QRasterPaintEngine *)0x572ef0);
  r = QRasterPaintEnginePrivate::clip(in_stack_ffffffffffffffe8);
  if (r == (QClipData *)0x0) {
    QRectF::QRectF((QRectF *)this_00,(QRect *)0x0);
  }
  else if (((byte)r->field_0x48 >> 1 & 1) == 0) {
    QRectF::QRectF(in_RDI,(double)r->xmin,(double)r->ymin,(double)(r->xmax - r->xmin),
                   (double)(r->ymax - r->ymin));
  }
  else {
    QRectF::QRectF((QRectF *)this_00,(QRect *)r);
  }
  return in_RDI;
}

Assistant:

QRectF QRasterPaintEngine::clipBoundingRect() const
{
    Q_D(const QRasterPaintEngine);

    const QClipData *clip = d->clip();

    if (!clip)
        return d->deviceRect;

    if (clip->hasRectClip)
        return clip->clipRect;

    return QRectF(clip->xmin, clip->ymin, clip->xmax - clip->xmin, clip->ymax - clip->ymin);
}